

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall FIX::DoubleField::DoubleField(DoubleField *this,int field,double data,int padding)

{
  int in_ECX;
  string local_48;
  int local_24;
  double dStack_20;
  int padding_local;
  double data_local;
  DoubleField *pDStack_10;
  int field_local;
  DoubleField *this_local;
  
  local_24 = padding;
  dStack_20 = data;
  data_local._4_4_ = field;
  pDStack_10 = this;
  DoubleConvertor::convert_abi_cxx11_
            (&local_48,(DoubleConvertor *)(ulong)(uint)padding,data,0xf,in_ECX);
  FieldBase::FieldBase(&this->super_FieldBase,field,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__DoubleField_0017c3c0;
  return;
}

Assistant:

explicit DoubleField(int field, double data, int padding = 0)
      : FieldBase(field, DoubleConvertor::convert(data, padding)) {}